

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

void compareModel(ModelPtr *m1,ModelPtr *m2)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  AssertionResult gtest_ar_2;
  EntityPtr local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  libcellml::Entity::id_abi_cxx11_();
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"m1->id()","m2->id()",&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x182,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_50._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
      local_50._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::NamedEntity::name_abi_cxx11_();
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_80,"m1->name()","m2->name()",&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x183,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_50._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
      local_50._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70._M_dataplus._M_p = (pointer)libcellml::Model::unitsCount();
  local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_50,"m1->unitsCount()","m2->unitsCount()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_80);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x185,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70._M_dataplus._M_p = (pointer)libcellml::ComponentEntity::componentCount();
  local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_50,"m1->componentCount()","m2->componentCount()",
             (unsigned_long *)&local_70,(unsigned_long *)&local_80);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x186,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar2 = libcellml::Model::unitsCount();
  if (lVar2 != 0) {
    uVar5 = 0;
    do {
      libcellml::Model::units((ulong)&local_50);
      libcellml::Model::units((ulong)&local_70);
      local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (m2->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (m2->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 8) =
               *(int *)(local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 8) =
               *(int *)(local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 8) + 1;
        }
      }
      compareUnits((UnitsPtr *)&local_50,(UnitsPtr *)&local_70,&local_80);
      if (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
      }
      uVar5 = uVar5 + 1;
      uVar3 = libcellml::Model::unitsCount();
    } while (uVar5 < uVar3);
  }
  lVar2 = libcellml::ComponentEntity::componentCount();
  if (lVar2 != 0) {
    uVar5 = 0;
    do {
      libcellml::ComponentEntity::component((ulong)&local_50);
      libcellml::ComponentEntity::component((ulong)&local_70);
      local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (m2->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (m2->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 8) =
               *(int *)(local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 8) =
               *(int *)(local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 8) + 1;
        }
      }
      compareComponent((ComponentPtr *)&local_50,(ComponentPtr *)&local_70,&local_80);
      if (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
      }
      uVar5 = uVar5 + 1;
      uVar3 = libcellml::ComponentEntity::componentCount();
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void compareModel(const libcellml::ModelPtr &m1, const libcellml::ModelPtr &m2)
{
    EXPECT_EQ(m1->id(), m2->id());
    EXPECT_EQ(m1->name(), m2->name());

    EXPECT_EQ(m1->unitsCount(), m2->unitsCount());
    EXPECT_EQ(m1->componentCount(), m2->componentCount());

    for (size_t index = 0; index < m1->unitsCount(); ++index) {
        auto u1 = m1->units(index);
        auto u2 = m2->units(index);
        compareUnits(u1, u2, m2);
    }

    for (size_t index = 0; index < m1->componentCount(); ++index) {
        auto c1 = m1->component(index);
        auto c2 = m2->component(index);
        compareComponent(c1, c2, m2);
    }
}